

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O3

void pybind11::class_<ki::protocol::control::ServerKeepAlive>::dealloc(value_and_holder *v_h)

{
  byte *pbVar1;
  void **ppvVar2;
  instance *piVar3;
  byte bVar4;
  
  bVar4 = v_h->inst->field_0x30;
  if ((bVar4 & 2) == 0) {
    bVar4 = (v_h->inst->field_1).nonsimple.status[v_h->index];
  }
  else {
    bVar4 = bVar4 >> 2;
  }
  ppvVar2 = v_h->vh;
  if ((bVar4 & 1) == 0) {
    operator_delete(*ppvVar2);
  }
  else {
    if (ppvVar2[1] != (void *)0x0) {
      operator_delete(ppvVar2[1],0x10);
    }
    ppvVar2[1] = (void *)0x0;
    piVar3 = v_h->inst;
    if ((piVar3->field_0x30 & 2) == 0) {
      pbVar1 = (piVar3->field_1).nonsimple.status + v_h->index;
      *pbVar1 = *pbVar1 & 0xfe;
    }
    else {
      piVar3->field_0x30 = piVar3->field_0x30 & 0xfb;
    }
  }
  *v_h->vh = (void *)0x0;
  return;
}

Assistant:

static void dealloc(detail::value_and_holder &v_h) {
        if (v_h.holder_constructed()) {
            v_h.holder<holder_type>().~holder_type();
            v_h.set_holder_constructed(false);
        }
        else {
            detail::call_operator_delete(v_h.value_ptr<type>(), v_h.type->type_size);
        }
        v_h.value_ptr() = nullptr;
    }